

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

Gia_Man_t * Abc_GenSignedBoothPPTest(int nArgA,int nArgB)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  p = Gia_ManStart(1000);
  pcVar3 = (char *)malloc(6);
  builtin_strncpy(pcVar3,"booth",6);
  p->pName = pcVar3;
  iVar5 = 5;
  while( true ) {
    pGVar4 = Gia_ManAppendObj(p);
    uVar1 = *(ulong *)pGVar4;
    *(ulong *)pGVar4 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar4 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar2 = p->pObjs;
    if ((pGVar4 < pGVar2) || (pGVar2 + p->nObjs <= pGVar4)) break;
    Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
    if ((pGVar4 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar4)) break;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar5 = Abc_GenSignedBoothPP(p,2,4,6,8,10);
      Gia_ManAppendCo(p,iVar5);
      return p;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Abc_GenSignedBoothPPTest( int nArgA, int nArgB )
{
    Gia_Man_t * pNew; int i, iLit;
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );
    for ( i = 0; i < 5; i++ )
         Gia_ManAppendCi(pNew);
    iLit = Abc_GenSignedBoothPP( pNew, 2, 4, 6, 8, 10 );
    Gia_ManAppendCo(pNew, iLit);
    return pNew;
}